

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP5Writer::BP5Writer(BP5Writer *this,IO *io,string *name,Mode mode,Comm *comm)

{
  int iVar1;
  undefined8 *in_RDI;
  TimePoint this_00;
  ScopedTimer __var243;
  Comm *in_stack_00000458;
  JSONProfiler *in_stack_00000460;
  Comm *in_stack_fffffffffffffe48;
  FileDrainerSingleThread *in_stack_fffffffffffffe50;
  IO *in_stack_fffffffffffffe58;
  BP5Engine *in_stack_fffffffffffffe60;
  BP5Serializer *in_stack_fffffffffffffe80;
  Comm *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  Mode openMode;
  string *in_stack_fffffffffffffeb8;
  IO *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  Engine *in_stack_fffffffffffffed0;
  double local_88;
  double local_80;
  double local_78;
  double local_70 [4];
  allocator local_49;
  string local_48 [72];
  
  openMode = (Mode)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  BP5Engine::BP5Engine(in_stack_fffffffffffffe60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"BP5Writer",&local_49);
  helper::Comm::Comm((Comm *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Engine::Engine(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8,openMode,in_stack_fffffffffffffea8);
  helper::Comm::~Comm((Comm *)0xa80a3e);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  *in_RDI = &PTR__BP5Writer_0112fb50;
  adios2::format::BP5Serializer::BP5Serializer(in_stack_fffffffffffffe80);
  transportman::TransportMan::TransportMan
            ((TransportMan *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (Comm *)in_stack_fffffffffffffe50);
  transportman::TransportMan::TransportMan
            ((TransportMan *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (Comm *)in_stack_fffffffffffffe50);
  transportman::TransportMan::TransportMan
            ((TransportMan *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (Comm *)in_stack_fffffffffffffe50);
  transportman::TransportMan::TransportMan
            ((TransportMan *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (Comm *)in_stack_fffffffffffffe50);
  in_RDI[0xf8] = 0;
  *(undefined1 *)(in_RDI + 0xf9) = 1;
  *(undefined1 *)((long)in_RDI + 0x7c9) = 0;
  *(undefined1 *)((long)in_RDI + 0x7ca) = 1;
  burstbuffer::FileDrainerSingleThread::FileDrainerSingleThread(in_stack_fffffffffffffe50);
  std::__cxx11::string::string((string *)(in_RDI + 0x11f));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa80ba8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa80bc4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa80be0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa80bfc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa80c18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa80c34);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa80c50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xa80c6c);
  aggregator::MPIShmChain::MPIShmChain((MPIShmChain *)in_stack_fffffffffffffe80);
  aggregator::MPIChain::MPIChain((MPIChain *)in_stack_fffffffffffffe50);
  *(undefined1 *)(in_RDI + 0x15e) = 0;
  *(undefined1 *)((long)in_RDI + 0xaf1) = 0;
  helper::Comm::Comm((Comm *)0xa80ccc);
  aggregator::MPIChain::MPIChain((MPIChain *)in_stack_fffffffffffffe50);
  helper::Comm::Comm((Comm *)0xa80d02);
  profiling::JSONProfiler::JSONProfiler(in_stack_00000460,in_stack_00000458);
  in_RDI[0x181] = 0;
  in_RDI[0x182] = 0;
  in_RDI[0x183] = 0;
  in_RDI[0x184] = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa80d6b);
  *(undefined1 *)(in_RDI + 0x188) = 1;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xa80d8b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa80da4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa80dbd);
  std::future<int>::future((future<int> *)0xa80dd6);
  local_70[0] = 0.0;
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>
            ((duration<double,std::ratio<1l,1l>> *)(in_RDI + 0x19b),local_70);
  local_78 = 0.0;
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>
            ((duration<double,std::ratio<1l,1l>> *)(in_RDI + 0x19c),&local_78);
  local_80 = 0.0;
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>
            ((duration<double,std::ratio<1l,1l>> *)(in_RDI + 0x19d),&local_80);
  local_88 = 0.0;
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>
            ((duration<double,std::ratio<1l,1l>> *)(in_RDI + 0x19e),&local_88);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffe50);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffe50);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffe50);
  *(undefined1 *)((long)in_RDI + 0xd11) = 0;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffe50);
  in_RDI[0x1a4] = 0;
  std::
  vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
  ::vector((vector<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
            *)0xa80f01);
  in_RDI[0x1a8] = 0;
  shm::Spinlock::Spinlock((Spinlock *)(in_RDI + 0x1aa));
  this_00 = Now();
  ((duration *)(in_RDI + 0x1a0))->__r = (rep_conflict)this_00.__d.__r;
  if (BP5Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)::
      __var43 == '\0') {
    iVar1 = __cxa_guard_acquire(&BP5Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                                 ::__var43);
    if (iVar1 != 0) {
      BP5Writer::__var43 = (void *)ps_timer_create_("BP5Writer::Open");
      in_stack_fffffffffffffe48 = (Comm *)BP5Writer::__var43;
      __cxa_guard_release(&BP5Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                           ::__var43);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)this_00.__d.__r,in_stack_fffffffffffffe48);
  *(undefined1 *)(in_RDI[5] + 200) = 0;
  Init((BP5Writer *)this_00.__d.__r);
  *(undefined1 *)(in_RDI + 0x10) = 1;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)this_00.__d.__r);
  return;
}

Assistant:

BP5Writer::BP5Writer(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("BP5Writer", io, name, mode, std::move(comm)), m_BP5Serializer(),
  m_FileDataManager(io, m_Comm), m_FileMetadataManager(io, m_Comm),
  m_FileMetadataIndexManager(io, m_Comm), m_FileMetaMetadataManager(io, m_Comm), m_Profiler(m_Comm)
{
    m_EngineStart = Now();
    PERFSTUBS_SCOPED_TIMER("BP5Writer::Open");
    m_IO.m_ReadStreaming = false;

    Init();
    m_IsOpen = true;
}